

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O0

void __thiscall
QMdi::ControlElement<QMdi::ControllerWidget>::ControlElement
          (ControlElement<QMdi::ControllerWidget> *this,QMdiSubWindow *child)

{
  QPointer<QMdiSubWindow> *in_RSI;
  QMdiSubWindow *in_RDI;
  
  ControllerWidget::ControllerWidget(&this->super_ControllerWidget,&child->super_QWidget);
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d17720;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__ControlElement_00d178d0;
  QPointer<QMdiSubWindow>::QPointer((QPointer<QMdiSubWindow> *)0x638850);
  QPointer<QMdiSubWindow>::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }